

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_state.cpp
# Opt level: O2

CcsProperty * __thiscall
ccs::SearchState::doSearch(SearchState *this,CcsContext *context,string *propertyName)

{
  CcsTracer *pCVar1;
  Property *pPVar2;
  long lVar3;
  pointer ppPVar4;
  pointer ppPVar5;
  const_iterator cVar6;
  ulong uVar7;
  __normal_iterator<const_ccs::Property_**,_std::vector<const_ccs::Property_*,_std::allocator<const_ccs::Property_*>_>_>
  __i;
  long lVar8;
  Property **ppPVar9;
  vector<const_ccs::CcsProperty_*,_std::allocator<const_ccs::CcsProperty_*>_> baseValues;
  vector<const_ccs::Property_*,_std::allocator<const_ccs::Property_*>_> values;
  allocator_type local_79;
  _Vector_base<const_ccs::CcsProperty_*,_std::allocator<const_ccs::CcsProperty_*>_> local_78;
  _Vector_base<const_ccs::Property_*,_std::allocator<const_ccs::Property_*>_> local_60;
  _Vector_base<const_ccs::CcsProperty_*,_std::allocator<const_ccs::CcsProperty_*>_> local_48;
  
  do {
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>_>
            ::find(&(this->properties)._M_t,propertyName);
    if ((_Rb_tree_header *)cVar6._M_node != &(this->properties)._M_t._M_impl.super__Rb_tree_header)
    {
      if (cVar6._M_node[3]._M_right == (_Base_ptr)0x1) {
        return *(CcsProperty **)(cVar6._M_node[3]._M_parent + 1);
      }
      std::vector<ccs::Property_const*,std::allocator<ccs::Property_const*>>::
      vector<std::_Rb_tree_const_iterator<ccs::Property_const*>,void>
                ((vector<ccs::Property_const*,std::allocator<ccs::Property_const*>> *)&local_60,
                 cVar6._M_node[3]._M_parent,
                 (_Rb_tree_const_iterator<const_ccs::Property_*>)&cVar6._M_node[2]._M_right,
                 (allocator_type *)&local_78);
      ppPVar5 = local_60._M_impl.super__Vector_impl_data._M_finish;
      ppPVar4 = local_60._M_impl.super__Vector_impl_data._M_start;
      if (local_60._M_impl.super__Vector_impl_data._M_start !=
          local_60._M_impl.super__Vector_impl_data._M_finish) {
        lVar8 = (long)local_60._M_impl.super__Vector_impl_data._M_finish -
                (long)local_60._M_impl.super__Vector_impl_data._M_start;
        uVar7 = lVar8 >> 3;
        lVar3 = 0x3f;
        if (uVar7 != 0) {
          for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<ccs::Property_const**,std::vector<ccs::Property_const*,std::allocator<ccs::Property_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<ccs::SearchState::doSearch(ccs::CcsContext_const&,std::__cxx11::string_const&)const::__0>>
                  (local_60._M_impl.super__Vector_impl_data._M_start,
                   local_60._M_impl.super__Vector_impl_data._M_finish,
                   ((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar8 < 0x81) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<ccs::Property_const**,std::vector<ccs::Property_const*,std::allocator<ccs::Property_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<ccs::SearchState::doSearch(ccs::CcsContext_const&,std::__cxx11::string_const&)const::__0>>
                    (ppPVar4,ppPVar5);
        }
        else {
          ppPVar9 = ppPVar4 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<ccs::Property_const**,std::vector<ccs::Property_const*,std::allocator<ccs::Property_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<ccs::SearchState::doSearch(ccs::CcsContext_const&,std::__cxx11::string_const&)const::__0>>
                    (ppPVar4,ppPVar9);
          for (; ppPVar9 != ppPVar5; ppPVar9 = ppPVar9 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<ccs::Property_const**,std::vector<ccs::Property_const*,std::allocator<ccs::Property_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<ccs::SearchState::doSearch(ccs::CcsContext_const&,std::__cxx11::string_const&)const::__0>>
                      (ppPVar9);
          }
        }
      }
      std::vector<ccs::CcsProperty_const*,std::allocator<ccs::CcsProperty_const*>>::
      vector<__gnu_cxx::__normal_iterator<ccs::Property_const**,std::vector<ccs::Property_const*,std::allocator<ccs::Property_const*>>>,void>
                ((vector<ccs::CcsProperty_const*,std::allocator<ccs::CcsProperty_const*>> *)
                 &local_78,
                 (__normal_iterator<const_ccs::Property_**,_std::vector<const_ccs::Property_*,_std::allocator<const_ccs::Property_*>_>_>
                  )local_60._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<const_ccs::Property_**,_std::vector<const_ccs::Property_*,_std::allocator<const_ccs::Property_*>_>_>
                  )local_60._M_impl.super__Vector_impl_data._M_finish,&local_79);
      pCVar1 = this->tracer;
      std::vector<const_ccs::CcsProperty_*,_std::allocator<const_ccs::CcsProperty_*>_>::vector
                ((vector<const_ccs::CcsProperty_*,_std::allocator<const_ccs::CcsProperty_*>_> *)
                 &local_48,
                 (vector<const_ccs::CcsProperty_*,_std::allocator<const_ccs::CcsProperty_*>_> *)
                 &local_78);
      (*pCVar1->_vptr_CcsTracer[4])(pCVar1,context,propertyName,&local_48);
      std::_Vector_base<const_ccs::CcsProperty_*,_std::allocator<const_ccs::CcsProperty_*>_>::
      ~_Vector_base(&local_48);
      pPVar2 = local_60._M_impl.super__Vector_impl_data._M_finish[-1];
      std::_Vector_base<const_ccs::CcsProperty_*,_std::allocator<const_ccs::CcsProperty_*>_>::
      ~_Vector_base(&local_78);
      std::_Vector_base<const_ccs::Property_*,_std::allocator<const_ccs::Property_*>_>::
      ~_Vector_base(&local_60);
      return &pPVar2->super_CcsProperty;
    }
    this = (this->parent).super___shared_ptr<const_ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  } while (this != (element_type *)0x0);
  return (CcsProperty *)0x0;
}

Assistant:

const CcsProperty *SearchState::doSearch(const CcsContext &context,
    const std::string &propertyName) const {
  auto it = properties.find(propertyName);
  if (it == properties.end()) {
    if (parent) return parent->doSearch(context, propertyName);
    return nullptr;
  }

  if (it->second.values.size() == 1)
    return *it->second.values.begin();

  // it->second.values.size() > 1
  std::vector<const Property *> values(it->second.values.begin(),
      it->second.values.end());
  std::sort(values.begin(), values.end(),
      [](const Property *l, const Property *r) {
    return l->propertyNumber() < r->propertyNumber();
  });

  std::vector<const CcsProperty *> baseValues(values.begin(), values.end());
  tracer.onConflict(context, propertyName, baseValues);
  return values.back();
}